

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.h
# Opt level: O2

int IsFlat_C(int16_t *levels,int num_blocks,int thresh)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = 0;
  do {
    if (num_blocks < 1) {
      return 1;
    }
    num_blocks = num_blocks + -1;
    lVar2 = 1;
    while (lVar2 != 0x10) {
      iVar1 = (iVar1 + 1) - (uint)(levels[lVar2] == 0);
      lVar2 = lVar2 + 1;
      if (thresh < iVar1) {
        return 0;
      }
    }
    levels = levels + 0x10;
  } while( true );
}

Assistant:

static WEBP_INLINE int IsFlat(const int16_t* levels, int num_blocks,
                              int thresh) {
  int score = 0;
  while (num_blocks-- > 0) {      // TODO(skal): refine positional scoring?
    int i;
    for (i = 1; i < 16; ++i) {    // omit DC, we're only interested in AC
      score += (levels[i] != 0);
      if (score > thresh) return 0;
    }
    levels += 16;
  }
  return 1;
}